

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int timeout)

{
  char *pcVar1;
  int iVar2;
  char **local_68;
  char *new_timeout;
  char *save_timeout;
  char txt [32];
  int local_30;
  int ret;
  int err;
  int timeout_local;
  size_t ebuf_len_local;
  char *ebuf_local;
  mg_connection *conn_local;
  
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  ret = timeout;
  _err = ebuf_len;
  ebuf_len_local = (size_t)ebuf;
  ebuf_local = (char *)conn;
  if (conn == (mg_connection *)0x0) {
    mg_snprintf((mg_connection *)0x0,(int *)0x0,ebuf,ebuf_len,"%s","Parameter error");
    conn_local._4_4_ = -1;
  }
  else {
    conn->data_len = 0;
    pcVar1 = conn->dom_ctx->config[0xb];
    if (timeout < 0) {
      local_68 = (char **)0x0;
    }
    else {
      mg_snprintf(conn,(int *)0x0,(char *)&save_timeout,0x20,"%i",(ulong)(uint)timeout);
      local_68 = &save_timeout;
    }
    *(char ***)(*(long *)(ebuf_local + 0x8e8) + 0x60) = local_68;
    iVar2 = get_response((mg_connection *)ebuf_local,(char *)ebuf_len_local,_err,&local_30);
    *(char **)(*(long *)(ebuf_local + 0x8e8) + 0x60) = pcVar1;
    *(undefined8 *)(ebuf_local + 0x20) = *(undefined8 *)(ebuf_local + 0x18);
    *(undefined8 *)(ebuf_local + 0x28) = *(undefined8 *)(ebuf_local + 0x20);
    conn_local._4_4_ = 1;
    if (iVar2 == 0) {
      conn_local._4_4_ = -1;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_get_response(struct mg_connection *conn,
                char *ebuf,
                size_t ebuf_len,
                int timeout)
{
	int err, ret;
	char txt[32]; /* will not overflow */
	char *save_timeout;
	char *new_timeout;

	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}

	if (!conn) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Parameter error");
		return -1;
	}

	/* Reset the previous responses */
	conn->data_len = 0;

	/* Implementation of API function for HTTP clients */
	save_timeout = conn->dom_ctx->config[REQUEST_TIMEOUT];

	if (timeout >= 0) {
		mg_snprintf(conn, NULL, txt, sizeof(txt), "%i", timeout);
		new_timeout = txt;
	} else {
		new_timeout = NULL;
	}

	conn->dom_ctx->config[REQUEST_TIMEOUT] = new_timeout;
	ret = get_response(conn, ebuf, ebuf_len, &err);
	conn->dom_ctx->config[REQUEST_TIMEOUT] = save_timeout;

	/* TODO: here, the URI is the http response code */
	conn->request_info.local_uri_raw = conn->request_info.request_uri;
	conn->request_info.local_uri = conn->request_info.local_uri_raw;

	/* TODO (mid): Define proper return values - maybe return length?
	 * For the first test use <0 for error and >0 for OK */
	return (ret == 0) ? -1 : +1;
}